

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

bool millisInSystemRange(qint64 millis,qint64 slack)

{
  int iVar1;
  long in_RSI;
  long in_RDI;
  bool local_12;
  bool local_11;
  
  if ((millisInSystemRange(long_long,long_long)::bounds == '\0') &&
     (iVar1 = __cxa_guard_acquire(&millisInSystemRange(long_long,long_long)::bounds), iVar1 != 0)) {
    QLocalTime::computeSystemMillisRange();
    __cxa_guard_release(&millisInSystemRange(long_long,long_long)::bounds);
  }
  if (((millisInSystemRange::bounds.minClip & 1U) != 0) ||
     (local_11 = false, millisInSystemRange::bounds.min - in_RSI <= in_RDI)) {
    local_12 = (millisInSystemRange::bounds.maxClip & 1U) != 0 ||
               in_RDI <= millisInSystemRange::bounds.max + in_RSI;
    local_11 = local_12;
  }
  return local_11;
}

Assistant:

static inline bool millisInSystemRange(qint64 millis, qint64 slack = 0)
{
    static const auto bounds = QLocalTime::computeSystemMillisRange();
    return (bounds.minClip || millis >= bounds.min - slack)
        && (bounds.maxClip || millis <= bounds.max + slack);
}